

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

type llvm::yaml::yamlize<long>(IO *io,long *Val,bool param_3,EmptyContext *Ctx)

{
  StringRef Scalar;
  int iVar1;
  void *pvVar2;
  undefined7 in_register_00000011;
  size_type *psStack_88;
  string Storage;
  StringRef Str;
  raw_string_ostream Buffer;
  
  iVar1 = (*io->_vptr_IO[2])(io,Val,CONCAT71(in_register_00000011,param_3));
  if ((char)iVar1 == '\0') {
    psStack_88 = (size_type *)0x0;
    Storage._M_dataplus._M_p = (pointer)0x0;
    (*io->_vptr_IO[0x1b])(io,&psStack_88,0);
    Scalar.Length = (size_t)Storage._M_dataplus._M_p;
    Scalar.Data = (char *)psStack_88;
    pvVar2 = IO::getContext(io);
    join_0x00000010_0x00000000_ = ScalarTraits<long,_void>::input(Scalar,pvVar2,Val);
    if (Storage._32_8_ != 0) {
      Twine::Twine((Twine *)&Str.Length,(StringRef *)((long)&Storage.field_2 + 8));
      (*io->_vptr_IO[0x1f])(io,&Str.Length);
    }
  }
  else {
    Storage._M_dataplus._M_p = (pointer)0x0;
    Storage._M_string_length._0_1_ = 0;
    Str.Length = (size_t)&PTR__raw_string_ostream_010994b8;
    psStack_88 = &Storage._M_string_length;
    pvVar2 = IO::getContext(io);
    ScalarTraits<long,_void>::output(Val,pvVar2,(raw_ostream *)&Str.Length);
    unique0x100001d7 = Storage._M_dataplus._M_p;
    Storage.field_2._8_8_ = psStack_88;
    (*io->_vptr_IO[0x1b])(io,(undefined1 *)((long)&Storage.field_2 + 8),0);
    raw_string_ostream::~raw_string_ostream((raw_string_ostream *)&Str.Length);
    if (psStack_88 != &Storage._M_string_length) {
      operator_delete(psStack_88,
                      CONCAT71(Storage._M_string_length._1_7_,(undefined1)Storage._M_string_length)
                      + 1);
    }
  }
  return;
}

Assistant:

typename std::enable_if<has_ScalarTraits<T>::value, void>::type
yamlize(IO &io, T &Val, bool, EmptyContext &Ctx) {
  if ( io.outputting() ) {
    std::string Storage;
    raw_string_ostream Buffer(Storage);
    ScalarTraits<T>::output(Val, io.getContext(), Buffer);
    StringRef Str = Buffer.str();
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
  }
  else {
    StringRef Str;
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
    StringRef Result = ScalarTraits<T>::input(Str, io.getContext(), Val);
    if ( !Result.empty() ) {
      io.setError(Twine(Result));
    }
  }
}